

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

normal3d * tinyusdz::vcross(normal3d *__return_storage_ptr__,normal3d *a,normal3d *b)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  normal3d *n;
  normal3d *b_local;
  normal3d *a_local;
  
  dVar2 = value::normal3d::operator[](a,1);
  dVar3 = value::normal3d::operator[](b,2);
  dVar4 = value::normal3d::operator[](a,2);
  dVar5 = value::normal3d::operator[](b,1);
  pdVar1 = value::normal3d::operator[](__return_storage_ptr__,0);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::normal3d::operator[](a,2);
  dVar3 = value::normal3d::operator[](b,0);
  dVar4 = value::normal3d::operator[](a,0);
  dVar5 = value::normal3d::operator[](b,2);
  pdVar1 = value::normal3d::operator[](__return_storage_ptr__,1);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  dVar2 = value::normal3d::operator[](a,0);
  dVar3 = value::normal3d::operator[](b,1);
  dVar4 = value::normal3d::operator[](a,1);
  dVar5 = value::normal3d::operator[](b,0);
  pdVar1 = value::normal3d::operator[](__return_storage_ptr__,2);
  *pdVar1 = dVar2 * dVar3 + -(dVar4 * dVar5);
  return __return_storage_ptr__;
}

Assistant:

value::normal3d vcross(const value::normal3d &a, const value::normal3d &b)
{
  value::normal3d n;
  n[0] = a[1] * b[2] - a[2] * b[1];
  n[1] = a[2] * b[0] - a[0] * b[2];
  n[2] = a[0] * b[1] - a[1] * b[0];

  return n;
}